

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<LiteralExpressionAstNode>_> * __thiscall
Parser::parseLiteralExpression
          (optional<std::shared_ptr<LiteralExpressionAstNode>_> *__return_storage_ptr__,Parser *this
          )

{
  TokenType TVar1;
  element_type *peVar2;
  shared_ptr<LiteralExpressionAstNode> local_60;
  undefined1 local_50 [16];
  shared_ptr<Token> token;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffd8);
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &stack0xffffffffffffffd8);
  TVar1 = peVar2->tokenType;
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffd8);
  if ((TVar1 - BooleanLiteral < 2) || (TVar1 - StringLiteral < 3)) {
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffc0);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::nextToken((TokenBuffer *)local_50);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_50);
    std::make_shared<LiteralExpressionAstNode,std::shared_ptr<Token>&>
              ((shared_ptr<Token> *)&local_60);
    std::optional<std::shared_ptr<LiteralExpressionAstNode>_>::
    optional<std::shared_ptr<LiteralExpressionAstNode>,_true>(__return_storage_ptr__,&local_60);
    std::shared_ptr<LiteralExpressionAstNode>::~shared_ptr(&local_60);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffc0);
  }
  else {
    std::optional<std::shared_ptr<LiteralExpressionAstNode>_>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<LiteralExpressionAstNode>>
Parser::parseLiteralExpression() noexcept {

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::BooleanLiteral:
    case TokenType::StringLiteral:
    case TokenType::IntegerLiteral:
    case TokenType::FloatLiteral:
    case TokenType::UndefinedLiteral:
      break;
    default:
      return std::nullopt;
  }

  auto token = this->tokenBuffer->currentToken();
  this->tokenBuffer->nextToken();
  return std::make_shared<LiteralExpressionAstNode>(token);
}